

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::initShaderSources
          (ShaderTextureFunctionCase *this)

{
  Function FVar1;
  TextureType TVar2;
  Function FVar3;
  char *pcVar4;
  DataType DVar5;
  char *pcVar6;
  char *pcVar7;
  TextureFormat format;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  ostringstream *this_00;
  ostringstream vert;
  ostringstream frag;
  undefined1 auStack_378 [6];
  char local_372;
  byte local_371;
  undefined8 local_370;
  ostream *local_368;
  ulong local_360;
  char *local_358;
  CompareMode local_34c;
  uint local_348;
  int local_344;
  long *local_340 [2];
  long local_330 [2];
  long local_320 [14];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  FVar1 = (this->m_lookupSpec).function;
  local_34c = (this->m_textureSpec).sampler.compare;
  TVar2 = (this->m_textureSpec).type;
  iVar11 = 1;
  if (((local_34c == COMPAREMODE_NONE && TVar2 == TEXTURETYPE_2D) &&
      (iVar11 = 2, FVar1 != FUNCTION_TEXTUREPROJ)) && (FVar1 != FUNCTION_TEXTUREPROJLOD)) {
    iVar11 = (FVar1 == FUNCTION_TEXTUREPROJGRAD) + 1;
  }
  local_372 = (this->super_ShaderRenderCase).m_isVertexCase;
  local_371 = (this->m_lookupSpec).useBias;
  iVar16 = 0;
  if (((byte)(0x1b6 >> ((byte)FVar1 & 0x1f)) & FVar1 < FUNCTION_TEXELFETCH) != 0) {
    iVar16 = iVar11;
  }
  local_344 = iVar16 + ((uint)(local_34c != COMPAREMODE_NONE) - (uint)(TVar2 == TEXTURETYPE_2D)) + 3
  ;
  DVar5 = glu::getDataTypeFloatVec(local_344);
  pcVar6 = glu::getDataTypeName(DVar5);
  pcVar7 = glu::getPrecisionName(PRECISION_HIGHP);
  format = glu::mapGLInternalFormat((this->m_textureSpec).format);
  pcVar8 = glu::getDataTypeName
                     (((this->m_textureSpec).type & ~TEXTURETYPE_2D_ARRAY) == TEXTURETYPE_CUBE_MAP |
                      TYPE_FLOAT_VEC2);
  switch((this->m_textureSpec).type) {
  case TEXTURETYPE_2D:
    local_368 = (ostream *)CONCAT44(local_368._4_4_,0x2f);
    if (local_34c == COMPAREMODE_NONE) {
      DVar5 = glu::getSampler2DType(format);
      goto LAB_004f5b9e;
    }
    break;
  case TEXTURETYPE_CUBE_MAP:
    local_368 = (ostream *)CONCAT44(local_368._4_4_,0x30);
    if (local_34c == COMPAREMODE_NONE) {
      DVar5 = glu::getSamplerCubeType(format);
      goto LAB_004f5b9e;
    }
    break;
  case TEXTURETYPE_2D_ARRAY:
    local_368 = (ostream *)CONCAT44(local_368._4_4_,0x32);
    if (local_34c == COMPAREMODE_NONE) {
      DVar5 = glu::getSampler2DArrayType(format);
      goto LAB_004f5b9e;
    }
    break;
  case TEXTURETYPE_3D:
    DVar5 = glu::getSampler3DType(format);
LAB_004f5b9e:
    local_368 = (ostream *)CONCAT44(local_368._4_4_,DVar5);
    break;
  default:
    local_368 = (ostream *)CONCAT44(local_368._4_4_,0x5e);
  }
  FVar3 = (this->m_lookupSpec).function;
  switch(FVar3) {
  case FUNCTION_TEXTURE:
    local_358 = "texture";
    break;
  case FUNCTION_TEXTUREPROJ:
  case FUNCTION_TEXTUREPROJ3:
    local_358 = "textureProj";
    break;
  case FUNCTION_TEXTURELOD:
    local_358 = "textureLod";
    break;
  case FUNCTION_TEXTUREPROJLOD:
  case FUNCTION_TEXTUREPROJLOD3:
    local_358 = "textureProjLod";
    break;
  case FUNCTION_TEXTUREGRAD:
    local_358 = "textureGrad";
    break;
  case FUNCTION_TEXTUREPROJGRAD:
  case FUNCTION_TEXTUREPROJGRAD3:
    local_358 = "textureProjGrad";
    break;
  case FUNCTION_TEXELFETCH:
    local_358 = "texelFetch";
    break;
  default:
    local_370 = (char *)CONCAT44(local_370._4_4_,(int)CONCAT71((uint7)(uint3)(FVar3 >> 8),1));
    local_358 = (char *)0x0;
    goto LAB_004f5c1b;
  }
  local_370 = (char *)((ulong)local_370._4_4_ << 0x20);
LAB_004f5c1b:
  local_360 = (ulong)FVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  this_00 = (ostringstream *)local_1a8;
  if (local_372 != '\0') {
    this_00 = (ostringstream *)local_320;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
  }
  else {
    sVar9 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
  }
  else {
    sVar9 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar6,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_in0;\n",8);
  uVar13 = (uint)local_360;
  local_348 = uVar13 - 6;
  if (local_348 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_in1;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar8,sVar9);
    }
    lVar12 = 8;
    pcVar15 = " a_in2;\n";
LAB_004f5f25:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar15,lVar12);
  }
  else if (((local_371 & 1) != 0) || ((uVar13 < 10 && ((0x238U >> (uVar13 & 0x1f) & 1) != 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
    }
    lVar12 = 0xe;
    pcVar15 = " float a_in1;\n";
    goto LAB_004f5f25;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if (local_372 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," v_texCoord;\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1d0);
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1d0);
    }
    else {
      sVar9 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_texCoord;\n",0xd);
    if (local_348 < 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," v_gradX;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," v_gradY;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1d0);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1d0);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_gradX;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1d0);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1d0);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_gradY;\n",10);
    }
    if (((local_371 & 1) != 0) ||
       (((uint)local_360 < 10 && ((0x238U >> ((uint)local_360 & 0x1f) & 1) != 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x58);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
      }
      pcVar6 = " float v_lodBias;\n";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320," float v_lodBias;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      if (pcVar7 == (char *)0x0) {
        lVar12 = 0x12;
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1d0);
      }
      else {
        sVar9 = strlen(pcVar7);
        lVar12 = 0x12;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar9);
      }
      goto LAB_004f6534;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"out mediump vec4 v_color;\n",0x1a);
    lVar12 = 0x19;
    pcVar6 = "in mediump vec4 v_color;\n";
LAB_004f6534:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"uniform highp ",0xe);
  pcVar6 = glu::getDataTypeName((DataType)local_368);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
  }
  else {
    sVar9 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar6,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," u_sampler;\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"uniform highp vec4 u_scale;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"uniform highp vec4 u_bias;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\nvoid main()\n{\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  local_368 = (ostream *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>(local_368,"\nvoid main()\n{\n",0xf);
  if (local_372 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\to_color = ",0xb);
    pcVar6 = "v_texCoord";
    pcVar8 = "v_gradX";
    pcVar7 = "v_gradY";
    pcVar15 = "v_lodBias";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_color = ",0xb);
    pcVar6 = "a_in0";
    pcVar7 = "a_in2";
    pcVar15 = "a_in1";
    pcVar8 = "a_in1";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec4(",5);
  pcVar4 = local_358;
  if ((char)local_370 == '\0') {
    local_370 = pcVar6;
    sVar9 = strlen(local_358);
    pcVar6 = local_370;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,sVar9);
  }
  else {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
  }
  if ((this->m_lookupSpec).useOffset == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Offset",6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(u_sampler, ",0xc);
  if ((uint)local_360 == 9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ivec",4);
    poVar10 = (ostream *)std::ostream::operator<<(this_00,local_344);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
  }
  sVar9 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar6,sVar9);
  if ((uint)local_360 == 9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
  }
  if (local_348 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar8,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    sVar9 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,sVar9);
  }
  if (((uint)local_360 < 10) && ((0x238U >> ((uint)local_360 & 0x1f) & 1) != 0)) {
    if ((uint)local_360 == 9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", int(",6);
      sVar9 = strlen(pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar15,sVar9);
      sVar9 = 1;
      pcVar6 = ")";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      sVar9 = strlen(pcVar15);
      pcVar6 = pcVar15;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar6,sVar9);
  }
  if ((this->m_lookupSpec).useOffset == true) {
    TVar2 = (this->m_textureSpec).type;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ivec",6);
    uVar13 = TVar2 == TEXTURETYPE_3D | 2;
    poVar10 = (ostream *)std::ostream::operator<<(this_00,uVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
    uVar14 = 0;
    do {
      if (uVar14 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      }
      std::ostream::operator<<(this_00,(this->m_lookupSpec).offset.m_data[uVar14]);
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
  }
  if ((this->m_lookupSpec).useBias == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    sVar9 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar15,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
  pcVar6 = ")*u_scale + u_bias";
  if (local_34c != COMPAREMODE_NONE) {
    pcVar6 = ", 0.0, 0.0, 1.0)";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar6,(ulong)(local_34c == COMPAREMODE_NONE) * 2 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,";\n",2);
  lVar12 = 0x14;
  if (local_372 == '\0') {
    local_368 = (ostream *)local_320;
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"\tv_texCoord = a_in0;\n",0x15);
    if (local_348 < 3) {
      lVar12 = 0x12;
      local_368 = (ostream *)local_320;
      std::__ostream_insert<char,std::char_traits<char>>(local_368,"\tv_gradX = a_in1;\n",0x12);
      pcVar6 = "\tv_gradY = a_in2;\n";
    }
    else {
      pcVar6 = "\tv_lodBias = a_in1;\n";
      if (((local_371 & 1) == 0) &&
         ((9 < (uint)local_360 || ((0x238U >> ((uint)local_360 & 0x1f) & 1) == 0))))
      goto LAB_004f6a2f;
    }
  }
  else {
    pcVar6 = "\to_color = v_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_368,pcVar6,lVar12);
LAB_004f6a2f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)local_340);
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)local_340);
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void ShaderTextureFunctionCase::initShaderSources (void)
{
	Function			function			= m_lookupSpec.function;
	bool				isVtxCase			= m_isVertexCase;
	bool				isProj				= functionHasProj(function);
	bool				isGrad				= functionHasGrad(function);
	bool				isShadow			= m_textureSpec.sampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	bool				is2DProj4			= !isShadow && m_textureSpec.type == TEXTURETYPE_2D && (function == FUNCTION_TEXTUREPROJ || function == FUNCTION_TEXTUREPROJLOD || function == FUNCTION_TEXTUREPROJGRAD);
	bool				isIntCoord			= function == FUNCTION_TEXELFETCH;
	bool				hasLodBias			= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	int					texCoordComps		= m_textureSpec.type == TEXTURETYPE_2D ? 2 : 3;
	int					extraCoordComps		= (isProj ? (is2DProj4 ? 2 : 1) : 0) + (isShadow ? 1 : 0);
	glu::DataType		coordType			= glu::getDataTypeFloatVec(texCoordComps+extraCoordComps);
	glu::Precision		coordPrec			= glu::PRECISION_HIGHP;
	const char*			coordTypeName		= glu::getDataTypeName(coordType);
	const char*			coordPrecName		= glu::getPrecisionName(coordPrec);
	tcu::TextureFormat	texFmt				= glu::mapGLInternalFormat(m_textureSpec.format);
	glu::DataType		samplerType			= glu::TYPE_LAST;
	glu::DataType		gradType			= (m_textureSpec.type == TEXTURETYPE_CUBE_MAP || m_textureSpec.type == TEXTURETYPE_3D) ? glu::TYPE_FLOAT_VEC3 : glu::TYPE_FLOAT_VEC2;
	const char*			gradTypeName		= glu::getDataTypeName(gradType);
	const char*			baseFuncName		= DE_NULL;

	DE_ASSERT(!isGrad || !hasLodBias);

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:		samplerType = isShadow ? glu::TYPE_SAMPLER_2D_SHADOW		: glu::getSampler2DType(texFmt);		break;
		case TEXTURETYPE_CUBE_MAP:	samplerType = isShadow ? glu::TYPE_SAMPLER_CUBE_SHADOW		: glu::getSamplerCubeType(texFmt);		break;
		case TEXTURETYPE_2D_ARRAY:	samplerType = isShadow ? glu::TYPE_SAMPLER_2D_ARRAY_SHADOW	: glu::getSampler2DArrayType(texFmt);	break;
		case TEXTURETYPE_3D:		DE_ASSERT(!isShadow); samplerType = glu::getSampler3DType(texFmt);									break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (m_lookupSpec.function)
	{
		case FUNCTION_TEXTURE:			baseFuncName = "texture";			break;
		case FUNCTION_TEXTUREPROJ:		baseFuncName = "textureProj";		break;
		case FUNCTION_TEXTUREPROJ3:		baseFuncName = "textureProj";		break;
		case FUNCTION_TEXTURELOD:		baseFuncName = "textureLod";		break;
		case FUNCTION_TEXTUREPROJLOD:	baseFuncName = "textureProjLod";	break;
		case FUNCTION_TEXTUREPROJLOD3:	baseFuncName = "textureProjLod";	break;
		case FUNCTION_TEXTUREGRAD:		baseFuncName = "textureGrad";		break;
		case FUNCTION_TEXTUREPROJGRAD:	baseFuncName = "textureProjGrad";	break;
		case FUNCTION_TEXTUREPROJGRAD3:	baseFuncName = "textureProjGrad";	break;
		case FUNCTION_TEXELFETCH:		baseFuncName = "texelFetch";		break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	std::ostringstream	vert;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVtxCase ? vert : frag;

	vert << "#version 300 es\n"
		 << "in highp vec4 a_position;\n"
		 << "in " << coordPrecName << " " << coordTypeName << " a_in0;\n";

	if (isGrad)
	{
		vert << "in " << coordPrecName << " " << gradTypeName << " a_in1;\n";
		vert << "in " << coordPrecName << " " << gradTypeName << " a_in2;\n";
	}
	else if (hasLodBias)
		vert << "in " << coordPrecName << " float a_in1;\n";

	frag << "#version 300 es\n"
		 << "layout(location = 0) out mediump vec4 o_color;\n";

	if (isVtxCase)
	{
		vert << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vert << "out " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";
		frag << "in " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";

		if (isGrad)
		{
			vert << "out " << coordPrecName << " " << gradTypeName << " v_gradX;\n";
			vert << "out " << coordPrecName << " " << gradTypeName << " v_gradY;\n";
			frag << "in " << coordPrecName << " " << gradTypeName << " v_gradX;\n";
			frag << "in " << coordPrecName << " " << gradTypeName << " v_gradY;\n";
		}

		if (hasLodBias)
		{
			vert << "out " << coordPrecName << " float v_lodBias;\n";
			frag << "in " << coordPrecName << " float v_lodBias;\n";
		}
	}

	// Uniforms
	op << "uniform highp " << glu::getDataTypeName(samplerType) << " u_sampler;\n"
	   << "uniform highp vec4 u_scale;\n"
	   << "uniform highp vec4 u_bias;\n";

	vert << "\nvoid main()\n{\n"
		 << "\tgl_Position = a_position;\n";
	frag << "\nvoid main()\n{\n";

	if (isVtxCase)
		vert << "\tv_color = ";
	else
		frag << "\to_color = ";

	// Op.
	{
		const char*	texCoord	= isVtxCase ? "a_in0" : "v_texCoord";
		const char* gradX		= isVtxCase ? "a_in1" : "v_gradX";
		const char* gradY		= isVtxCase ? "a_in2" : "v_gradY";
		const char*	lodBias		= isVtxCase ? "a_in1" : "v_lodBias";

		op << "vec4(" << baseFuncName;
		if (m_lookupSpec.useOffset)
			op << "Offset";
		op << "(u_sampler, ";

		if (isIntCoord)
			op << "ivec" << (texCoordComps+extraCoordComps) << "(";

		op << texCoord;

		if (isIntCoord)
			op << ")";

		if (isGrad)
			op << ", " << gradX << ", " << gradY;

		if (functionHasLod(function))
		{
			if (isIntCoord)
				op << ", int(" << lodBias << ")";
			else
				op << ", " << lodBias;
		}

		if (m_lookupSpec.useOffset)
		{
			int offsetComps = m_textureSpec.type == TEXTURETYPE_3D ? 3 : 2;

			op << ", ivec" << offsetComps << "(";
			for (int ndx = 0; ndx < offsetComps; ndx++)
			{
				if (ndx != 0)
					op << ", ";
				op << m_lookupSpec.offset[ndx];
			}
			op << ")";
		}

		if (m_lookupSpec.useBias)
			op << ", " << lodBias;

		op << ")";

		if (isShadow)
			op << ", 0.0, 0.0, 1.0)";
		else
			op << ")*u_scale + u_bias";

		op << ";\n";
	}

	if (isVtxCase)
		frag << "\to_color = v_color;\n";
	else
	{
		vert << "\tv_texCoord = a_in0;\n";

		if (isGrad)
		{
			vert << "\tv_gradX = a_in1;\n";
			vert << "\tv_gradY = a_in2;\n";
		}
		else if (hasLodBias)
			vert << "\tv_lodBias = a_in1;\n";
	}

	vert << "}\n";
	frag << "}\n";

	m_vertShaderSource = vert.str();
	m_fragShaderSource = frag.str();
}